

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_after_next_call_previous_controls_are_cleared_out_Test
::
~SubjectSetRegisterTest_next_subscription_sync_after_next_call_previous_controls_are_cleared_out_Test
          (SubjectSetRegisterTest_next_subscription_sync_after_next_call_previous_controls_are_cleared_out_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_after_next_call_previous_controls_are_cleared_out)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_RFS_SUBJECT1, false);
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    subject_register.NextSubscriptionSync()->GetSubjects();

    subject_register.Unregister(SS_RFS_SUBJECT1);
    subject_register.Unregister(SS_RFQ_SUBJECT3);
    subject_register.Register(SS_RFS_SUBJECT1, true);
    subject_register.Register(SS_RFQ_SUBJECT3, false);

    EXPECT_EQ(2, subject_register.NextSubscriptionSync()->GetControls().size());

    subject_register.Register(SS_SUBJECT0, false);
    EXPECT_TRUE(subject_register.NextSubscriptionSync()->GetControls().empty());
}